

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::clear(Board *this)

{
  Vector2u *pVVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  locale alStack_48 [8];
  String local_40;
  
  pVVar1 = &this->_size;
  if ((this->_size).y != 0) {
    uVar4 = 0;
    do {
      uVar2 = pVVar1->x;
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          if (this->_tileArray[uVar4][uVar3] != (Tile *)0x0) {
            (*this->_tileArray[uVar4][uVar3]->_vptr_Tile[1])();
            uVar2 = pVVar1->x;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar2);
      }
      if (this->_tileArray[uVar4] != (Tile **)0x0) {
        operator_delete__(this->_tileArray[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->_size).y);
  }
  if (this->_tileArray != (Tile ***)0x0) {
    operator_delete__(this->_tileArray);
  }
  sf::VertexArray::clear(&this->_vertices);
  pVVar1->x = 0;
  pVVar1->y = 0;
  this->_tileArray = (Tile ***)0x0;
  local_40.m_string._M_dataplus._M_p = (pointer)0x0;
  sf::RectangleShape::setSize(&this->_notesBox,(Vector2f *)&local_40);
  std::locale::locale(alStack_48);
  sf::String::String(&local_40,"",alStack_48);
  sf::Text::setString(&this->_notesText,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_40.m_string._M_dataplus._M_p != &local_40.m_string.field_2) {
    operator_delete(local_40.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(alStack_48);
  this->changesMade = false;
  return;
}

Assistant:

void Board::clear() {
    for (unsigned int y = 0; y < _size.y; ++y) {
        for (unsigned int x = 0; x < _size.x; ++x) {
            delete _tileArray[y][x];
        }
        delete[] _tileArray[y];
    }
    delete[] _tileArray;
    _vertices.clear();
    _size = Vector2u(0, 0);
    _tileArray = nullptr;
    _notesBox.setSize(Vector2f(0.0f, 0.0f));
    _notesText.setString("");
    changesMade = false;
}